

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O1

QObject * __thiscall QLibraryPrivate::pluginInstance(QLibraryPrivate *this)

{
  QMutex *this_00;
  __pointer_type pQVar1;
  Data *pDVar2;
  QtPluginInstanceFunction p_Var3;
  QObject *pQVar4;
  ExternalRefCountData *pEVar5;
  bool bVar6;
  
  this_00 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar6 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar6) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar6) goto LAB_004a2523;
  }
  else {
LAB_004a2523:
    QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
  }
  pDVar2 = (this->inst).wp.d;
  if ((pDVar2 == (Data *)0x0) || ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0))
  {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar4 = (this->inst).wp.value;
  }
  LOCK();
  pQVar1 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,pQVar1);
  }
  if (pQVar4 != (QObject *)0x0) {
    return pQVar4;
  }
  p_Var3 = (this->instanceFactory).super_QBasicAtomicPointer<QObject_*()>._q_value._M_b._M_p;
  if (p_Var3 == (QtPluginInstanceFunction)0x0) {
    p_Var3 = loadPlugin(this);
  }
  if (p_Var3 == (QtPluginInstanceFunction)0x0) {
    return (QObject *)0x0;
  }
  pQVar4 = (*p_Var3)();
  if ((this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar6 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar6) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar6) goto LAB_004a259e;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_004a259e:
  pDVar2 = (this->inst).wp.d;
  if (((pDVar2 == (Data *)0x0) || ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0))
     || ((this->inst).wp.value == (QObject *)0x0)) {
    if (pQVar4 == (QObject *)0x0) {
      pEVar5 = (ExternalRefCountData *)0x0;
    }
    else {
      pEVar5 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar4);
    }
    pDVar2 = (this->inst).wp.d;
    (this->inst).wp.d = pEVar5;
    (this->inst).wp.value = pQVar4;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar2);
      }
    }
  }
  else if ((pDVar2 == (Data *)0x0) ||
          ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    pQVar4 = (this->inst).wp.value;
  }
  LOCK();
  pQVar1 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,pQVar1);
  }
  return pQVar4;
}

Assistant:

QObject *QLibraryPrivate::pluginInstance()
{
    // first, check if the instance is cached and hasn't been deleted
    QObject *obj = [&](){ QMutexLocker locker(&mutex); return inst.data(); }();
    if (obj)
        return obj;

    // We need to call the plugin's factory function. Is that cached?
    // skip increasing the reference count (why? -Thiago)
    QtPluginInstanceFunction factory = instanceFactory.loadAcquire();
    if (!factory)
        factory = loadPlugin();

    if (!factory)
        return nullptr;

    obj = factory();

    // cache again
    QMutexLocker locker(&mutex);
    if (inst)
        obj = inst;
    else
        inst = obj;
    return obj;
}